

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# webassembly.cc
# Opt level: O2

bool bloaty::wasm::ReadMagic(string_view *data)

{
  uint uVar1;
  
  uVar1 = ReadFixed<unsigned_int,4ul>(data);
  if (uVar1 == 0x6d736100) {
    ReadFixed<unsigned_int,4ul>(data);
  }
  return uVar1 == 0x6d736100;
}

Assistant:

bool ReadMagic(string_view* data) {
  const uint32_t wasm_magic = 0x6d736100;
  auto magic = ReadFixed<uint32_t>(data);

  if (magic != wasm_magic) {
    return false;
  }

  // TODO(haberman): do we need to fail if this is >1?
  auto version = ReadFixed<uint32_t>(data);
  (void)version;

  return true;
}